

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z_libpd.c
# Opt level: O3

int libpd_pitchbend(int channel,int value)

{
  int iVar1;
  
  iVar1 = -1;
  if (0xffffbfff < value - 0x2000U && -1 < channel) {
    sys_lock();
    inmidi_pitchbend((uint)channel >> 4,channel & 0xf,value + 0x2000);
    sys_unlock();
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int libpd_pitchbend(int channel, int value) {
  CHECK_CHANNEL
  if (value < -8192 || value > 8191) return -1;
  sys_lock();
  inmidi_pitchbend(PORT, CHANNEL, value + 8192);
  sys_unlock();
  return 0;
}